

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O3

int setlineno(int n)

{
  mgwin *pmVar1;
  line *plVar2;
  line *plVar3;
  int iVar4;
  
  pmVar1 = curwp;
  if (n < 0) {
    curwp->w_dotline = curwp->w_bufp->b_lines + n;
    plVar2 = curbp->b_headp->l_bp;
    do {
      plVar3 = plVar2->l_bp;
      if (plVar3 == curbp->b_headp) {
        pmVar1->w_dotline = 1;
        plVar3 = plVar2;
        break;
      }
      n = n + 1;
      plVar2 = plVar3;
    } while (n != 0);
  }
  else {
    iVar4 = n + (uint)(n == 0);
    curwp->w_dotline = iVar4;
    iVar4 = iVar4 + 1;
    plVar2 = curbp->b_headp->l_fp;
    do {
      plVar3 = plVar2;
      iVar4 = iVar4 + -1;
      if (iVar4 < 2) goto LAB_00108553;
      plVar2 = plVar3->l_fp;
    } while (plVar3->l_fp != curbp->b_headp);
    pmVar1->w_dotline = pmVar1->w_bufp->b_lines;
  }
LAB_00108553:
  pmVar1->w_dotp = plVar3;
  pmVar1->w_doto = 0;
  pmVar1->w_rflag = pmVar1->w_rflag | 2;
  return 1;
}

Assistant:

int
setlineno(int n)
{
	struct line  *clp;

	if (n >= 0) {
		if (n == 0)
			n++;
		curwp->w_dotline = n;
		clp = lforw(curbp->b_headp);	/* "clp" is first line */
		while (--n > 0) {
			if (lforw(clp) == curbp->b_headp) {
				curwp->w_dotline = curwp->w_bufp->b_lines;
				break;
			}
			clp = lforw(clp);
		}
	} else {
		curwp->w_dotline = curwp->w_bufp->b_lines + n;
		clp = lback(curbp->b_headp);	/* "clp" is last line */
		while (n < 0) {
			if (lback(clp) == curbp->b_headp) {
				curwp->w_dotline = 1;
				break;
			}
			clp = lback(clp);
			n++;
		}
	}
	curwp->w_dotp = clp;
	curwp->w_doto = 0;
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}